

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetDeviceLinkFlags
          (cmLocalGenerator *this,cmLinkLineDeviceComputer *linkLineComputer,string *config,
          string *linkLibs,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  cmComputeLinkInformation *cli;
  cmValue cVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkOpts;
  DeviceLinkSetter setter;
  string linklang;
  allocator<char> local_a9;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string *local_70;
  string *local_68;
  DeviceLinkSetter local_60;
  string local_50;
  
  local_70 = linkLibs;
  local_68 = frameworkPath;
  cmGeneratorTarget::DeviceLinkSetter::DeviceLinkSetter(&local_60,target);
  cli = cmGeneratorTarget::GetLinkInformation(target,config);
  (*(linkLineComputer->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[4])
            (&local_50,linkLineComputer,target,config);
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,&local_50,config);
  if (!bVar1) {
    bVar1 = cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(linkLineComputer,cli);
    if (!bVar1) goto LAB_0021edf8;
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_CUDA_DEVICE_LINK_OPTIONS_IPO",(allocator<char> *)&local_88);
  cVar2 = cmMakefile::GetDefinition(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::append((string *)linkFlags);
  }
LAB_0021edf8:
  if (cli != (cmComputeLinkInformation *)0x0) {
    OutputLinkLibraries(this,cli,&linkLineComputer->super_cmLinkLineComputer,local_70,local_68,
                        linkPath);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CUDA",(allocator<char> *)&local_88);
  AddVisibilityPresetFlags(this,linkFlags,target,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x3c])(this->GlobalGenerator,linkFlags);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"CUDA",&local_a9);
  cmGeneratorTarget::GetLinkOptions(target,&local_88,config,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  cmOutputConverter::SetLinkScriptShell
            (&this->super_cmOutputConverter,this->GlobalGenerator->UseLinkScript);
  AppendCompileOptions(this,linkFlags,&local_88,(char *)0x0);
  cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  cmGeneratorTarget::DeviceLinkSetter::~DeviceLinkSetter(&local_60);
  return;
}

Assistant:

void cmLocalGenerator::GetDeviceLinkFlags(
  cmLinkLineDeviceComputer& linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& linkFlags, std::string& frameworkPath,
  std::string& linkPath, cmGeneratorTarget* target)
{
  cmGeneratorTarget::DeviceLinkSetter setter(*target);

  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);

  auto linklang = linkLineComputer.GetLinkerLanguage(target, config);
  auto ipoEnabled = target->IsIPOEnabled(linklang, config);
  if (!ipoEnabled) {
    ipoEnabled = linkLineComputer.ComputeRequiresDeviceLinkingIPOFlag(*pcli);
  }
  if (ipoEnabled) {
    if (cmValue cudaIPOFlags = this->Makefile->GetDefinition(
          "CMAKE_CUDA_DEVICE_LINK_OPTIONS_IPO")) {
      linkFlags += *cudaIPOFlags;
    }
  }

  if (pcli) {
    // Compute the required device link libraries when
    // resolving gpu lang device symbols
    this->OutputLinkLibraries(pcli, &linkLineComputer, linkLibs, frameworkPath,
                              linkPath);
  }

  this->AddVisibilityPresetFlags(linkFlags, target, "CUDA");
  this->GetGlobalGenerator()->EncodeLiteral(linkFlags);

  std::vector<std::string> linkOpts;
  target->GetLinkOptions(linkOpts, config, "CUDA");
  this->SetLinkScriptShell(this->GetGlobalGenerator()->GetUseLinkScript());
  // LINK_OPTIONS are escaped.
  this->AppendCompileOptions(linkFlags, linkOpts);
  this->SetLinkScriptShell(false);
}